

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# close.c
# Opt level: O0

void lws_addrinfo_clean(lws *wsi)

{
  lws_dll2 *plVar1;
  lws_dns_sort_t *r;
  lws_dll2 *d1;
  lws_dll2 *d;
  lws *wsi_local;
  
  d1 = lws_dll2_get_head(&wsi->dns_sorted_list);
  while (d1 != (lws_dll2 *)0x0) {
    plVar1 = d1->next;
    lws_dll2_remove(d1);
    lws_realloc(d1,0,"lws_free");
    d1 = plVar1;
  }
  return;
}

Assistant:

void
lws_addrinfo_clean(struct lws *wsi)
{
#if defined(LWS_WITH_CLIENT)
	struct lws_dll2 *d = lws_dll2_get_head(&wsi->dns_sorted_list), *d1;

	while (d) {
		lws_dns_sort_t *r = lws_container_of(d, lws_dns_sort_t, list);

		d1 = d->next;
		lws_dll2_remove(d);
		lws_free(r);

		d = d1;
	}
#endif
}